

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O0

void soul::CallFlowGraph::calculateLocalVariableStackSize(Function *f)

{
  bool bVar1;
  int iVar2;
  reference this;
  Variable *pVVar3;
  undefined4 extraout_var;
  uint64_t size;
  unsigned_long uVar4;
  pool_ref<soul::heart::Variable> *v;
  iterator __end3;
  iterator __begin3;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *__range3;
  uint64_t total;
  Function *f_local;
  
  if (f->localVariableStackSize == 0) {
    __range3 = (vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                *)0x0;
    heart::Function::getAllLocalVariables
              ((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                *)&__begin3,f);
    __end3 = std::
             vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
             ::begin((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                      *)&__begin3);
    v = (pool_ref<soul::heart::Variable> *)
        std::
        vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
        ::end((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
               *)&__begin3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                                  *)&v);
      if (!bVar1) break;
      this = __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
             ::operator*(&__end3);
      pVVar3 = pool_ref<soul::heart::Variable>::operator->(this);
      iVar2 = (*(pVVar3->super_Expression).super_Object._vptr_Object[2])();
      size = Type::getPackedSizeInBytes((Type *)CONCAT44(extraout_var,iVar2));
      uVar4 = getAlignedSize<8,unsigned_long>(size);
      __range3 = (vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                  *)((long)&(__range3->
                            super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar4);
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
    ::~vector((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
               *)&__begin3);
    f->localVariableStackSize = (uint64_t)__range3;
  }
  return;
}

Assistant:

static void calculateLocalVariableStackSize (heart::Function& f)
    {
        if (f.localVariableStackSize == 0)
        {
            uint64_t total = 0;

            for (auto& v : f.getAllLocalVariables())
                total += getAlignedSize<stackItemAlignment> (v->getType().getPackedSizeInBytes());

            f.localVariableStackSize = total;
        }
    }